

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

UBool __thiscall icu_63::UnifiedCache::_flush(UnifiedCache *this,UBool all)

{
  SharedObject *value;
  UBool UVar1;
  int32_t iVar2;
  UHashElement *element_00;
  SharedObject *sharedObject;
  UHashElement *element;
  int32_t i;
  int32_t origSize;
  UBool result;
  UBool all_local;
  UnifiedCache *this_local;
  
  i._2_1_ = '\0';
  iVar2 = uhash_count_63(this->fHashtable);
  element._4_4_ = 0;
  while ((element._4_4_ < iVar2 &&
         (element_00 = _nextElement(this), element_00 != (UHashElement *)0x0))) {
    if ((all != '\0') || (UVar1 = _isEvictable(this,element_00), UVar1 != '\0')) {
      value = (SharedObject *)(element_00->value).pointer;
      uhash_removeElement_63(this->fHashtable,element_00);
      removeSoftRef(this,value);
      i._2_1_ = '\x01';
    }
    element._4_4_ = element._4_4_ + 1;
  }
  return i._2_1_;
}

Assistant:

UBool UnifiedCache::_flush(UBool all) const {
    UBool result = FALSE;
    int32_t origSize = uhash_count(fHashtable);
    for (int32_t i = 0; i < origSize; ++i) {
        const UHashElement *element = _nextElement();
        if (element == nullptr) {
            break;
        }
        if (all || _isEvictable(element)) {
            const SharedObject *sharedObject =
                    (const SharedObject *) element->value.pointer;
            U_ASSERT(sharedObject->cachePtr == this);
            uhash_removeElement(fHashtable, element);
            removeSoftRef(sharedObject);    // Deletes the sharedObject when softRefCount goes to zero.
            result = TRUE;
        }
    }
    return result;
}